

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

bool QObjectPrivate::removeConnection(Connection *c)

{
  __pointer_type pQVar1;
  ConnectionData *this;
  QObject *pQVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  int __sig;
  QBasicMutex *m1;
  QBasicMutex *m2;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((c != (Connection *)0x0) &&
     (pQVar1 = (c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p,
     pQVar1 != (__pointer_type)0x0)) {
    uVar3 = (ulong)*(uint *)&c->sender % 0x418;
    m1 = (QBasicMutex *)
         ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + (ulong)((uint)uVar3 & 0x7f8));
    uVar4 = ((ulong)pQVar1 & 0xffffffff) % 0x418;
    m2 = (QBasicMutex *)
         ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + (ulong)((uint)uVar4 & 0x7f8));
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QOrderedMutexLocker::QOrderedMutexLocker((QOrderedMutexLocker *)local_58,m1,m2);
    if ((c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p != (__pointer_type)0x0)
    {
      this = (ConnectionData *)(c->sender->d_ptr).d[1].parent;
      ConnectionData::removeConnection(this,c);
      pQVar2 = c->sender;
      __sig = (**pQVar2->_vptr_QObject)(pQVar2);
      QMetaObjectPrivate::signal
                (__sig,(__sighandler_t)(ulong)(uint)((*(int *)&c->field_0x54 << 5) >> 5));
      (*pQVar2->_vptr_QObject[0xb])(pQVar2);
      if ((int)(uVar4 >> 3) != (int)(uVar3 >> 3)) {
        QBasicMutex::unlock(m2);
      }
      ConnectionData::cleanOrphanedConnections
                (this,c->sender,AlreadyLockedAndTemporarilyReleasingLock);
      QBasicMutex::unlock(m1);
      local_58._16_8_ = local_58._16_8_ & 0xffffffffffffff00;
      QOrderedMutexLocker::unlock((QOrderedMutexLocker *)local_58);
      bVar5 = true;
      goto LAB_00292545;
    }
    QOrderedMutexLocker::unlock((QOrderedMutexLocker *)local_58);
  }
  bVar5 = false;
LAB_00292545:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

inline bool QObjectPrivate::removeConnection(QObjectPrivate::Connection *c)
{
    if (!c)
        return false;
    QObject *receiver = c->receiver.loadRelaxed();
    if (!receiver)
        return false;

    QBasicMutex *senderMutex = signalSlotLock(c->sender);
    QBasicMutex *receiverMutex = signalSlotLock(receiver);

    QObjectPrivate::ConnectionData *connections;
    {
        QOrderedMutexLocker locker(senderMutex, receiverMutex);

        // load receiver once again and recheck to ensure nobody else has removed the connection in the meantime
        receiver = c->receiver.loadRelaxed();
        if (!receiver)
            return false;

        connections = QObjectPrivate::get(c->sender)->connections.loadRelaxed();
        Q_ASSERT(connections);
        connections->removeConnection(c);

        c->sender->disconnectNotify(QMetaObjectPrivate::signal(c->sender->metaObject(), c->signal_index));
        // We must not hold the receiver mutex, else we risk dead-locking; we also only need the sender mutex
        // It is however vital to hold the senderMutex before calling cleanOrphanedConnections, as otherwise
        // another thread might modify/delete the connection
        if (receiverMutex != senderMutex) {
            receiverMutex->unlock();
        }
        connections->cleanOrphanedConnections(c->sender, ConnectionData::AlreadyLockedAndTemporarilyReleasingLock);
        senderMutex->unlock(); // now both sender and receiver mutex have been manually unlocked
        locker.dismiss(); // so we dismiss the QOrderedMutexLocker
    }

    return true;
}